

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm_info.cc
# Opt level: O0

bool anon_unknown.dwarf_47b0::OutputCues
               (Segment *segment,Tracks *tracks,Options *options,FILE *o,Indent *indent)

{
  int iVar1;
  Indent *pIVar2;
  bool bVar3;
  uint uVar4;
  undefined8 uVar5;
  unsigned_long uVar6;
  long lVar7;
  ulong uVar8;
  longlong lVar9;
  Indent local_d8;
  TrackPosition *pTStack_b0;
  char track_type;
  TrackPosition *track_pos;
  Track *track;
  int local_98;
  int track_num;
  int num_tracks;
  int cue_point_num;
  CuePoint *cue_point;
  undefined1 local_68 [40];
  CuePoint *first_cue;
  Cues *cues;
  Indent *indent_local;
  FILE *o_local;
  Options *options_local;
  Tracks *tracks_local;
  Segment *segment_local;
  
  cues = (Cues *)indent;
  indent_local = (Indent *)o;
  o_local = (FILE *)options;
  options_local = (Options *)tracks;
  tracks_local = (Tracks *)segment;
  first_cue = (CuePoint *)mkvparser::Segment::GetCues(segment);
  if ((Cues *)first_cue != (Cues *)0x0) {
    while (bVar3 = mkvparser::Cues::DoneParsing((Cues *)first_cue), ((bVar3 ^ 0xffU) & 1) != 0) {
      mkvparser::Cues::LoadCuePoint((Cues *)first_cue);
    }
    local_68._32_8_ = mkvparser::Cues::GetFirst((Cues *)first_cue);
    pIVar2 = indent_local;
    if ((CuePoint *)local_68._32_8_ == (CuePoint *)0x0) {
      libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_68);
      uVar5 = std::__cxx11::string::c_str();
      fprintf((FILE *)pIVar2,"%sNo cue points.\n",uVar5);
      std::__cxx11::string::~string((string *)local_68);
    }
    else {
      libwebm::Indent::indent_str_abi_cxx11_((Indent *)&cue_point);
      uVar5 = std::__cxx11::string::c_str();
      fprintf((FILE *)pIVar2,"%sCues:",uVar5);
      std::__cxx11::string::~string((string *)&cue_point);
      if (((byte)o_local[3] & 1) != 0) {
        fprintf((FILE *)indent_local," @:%lld",first_cue->m_timecode);
      }
      if (((byte)o_local[2] & 1) != 0) {
        fprintf((FILE *)indent_local," size:%lld",first_cue->m_track_positions);
      }
      fprintf((FILE *)indent_local,"\n");
      _num_tracks = (CuePoint *)local_68._32_8_;
      track_num = 1;
      uVar6 = mkvparser::Tracks::GetTracksCount((Tracks *)options_local);
      local_98 = (int)uVar6;
      libwebm::Indent::Adjust((Indent *)cues,2);
      do {
        for (track._4_4_ = 0; track._4_4_ < local_98; track._4_4_ = track._4_4_ + 1) {
          track_pos = (TrackPosition *)
                      mkvparser::Tracks::GetTrackByIndex((Tracks *)options_local,(long)track._4_4_);
          pTStack_b0 = mkvparser::CuePoint::Find(_num_tracks,(Track *)track_pos);
          if (pTStack_b0 != (TrackPosition *)0x0) {
            lVar7 = mkvparser::Track::GetType((Track *)track_pos);
            pIVar2 = indent_local;
            local_d8._39_1_ = 'A';
            if (lVar7 == 1) {
              local_d8._39_1_ = 'V';
            }
            libwebm::Indent::indent_str_abi_cxx11_(&local_d8);
            uVar5 = std::__cxx11::string::c_str();
            iVar1 = track_num;
            uVar4 = (uint)(char)local_d8._39_1_;
            uVar8 = mkvparser::Track::GetNumber((Track *)track_pos);
            fprintf((FILE *)pIVar2,"%sCue Point:%d type:%c track:%d",uVar5,(ulong)(uint)iVar1,
                    (ulong)uVar4,uVar8 & 0xffffffff);
            std::__cxx11::string::~string((string *)&local_d8);
            pIVar2 = indent_local;
            if (((byte)o_local[4] & 1) == 0) {
              lVar9 = mkvparser::CuePoint::GetTime(_num_tracks,(Segment *)tracks_local);
              fprintf((FILE *)pIVar2," nano:%lld",lVar9);
            }
            else {
              lVar9 = mkvparser::CuePoint::GetTime(_num_tracks,(Segment *)tracks_local);
              fprintf((FILE *)pIVar2," secs:%g",(double)lVar9 / 1000000000.0);
            }
            if (((byte)o_local[0xb] & 1) != 0) {
              fprintf((FILE *)indent_local," block:%lld",pTStack_b0->m_block);
            }
            if (((byte)o_local[3] & 1) != 0) {
              fprintf((FILE *)indent_local," @:%lld",pTStack_b0->m_pos);
            }
            fprintf((FILE *)indent_local,"\n");
          }
        }
        _num_tracks = mkvparser::Cues::GetNext((Cues *)first_cue,_num_tracks);
        track_num = track_num + 1;
      } while (_num_tracks != (CuePoint *)0x0);
      libwebm::Indent::Adjust((Indent *)cues,-2);
    }
  }
  return true;
}

Assistant:

bool OutputCues(const mkvparser::Segment& segment,
                const mkvparser::Tracks& tracks, const Options& options,
                FILE* o, Indent* indent) {
  const mkvparser::Cues* const cues = segment.GetCues();
  if (cues == NULL)
    return true;

  // Load all of the cue points.
  while (!cues->DoneParsing())
    cues->LoadCuePoint();

  // Confirm that the input has cue points.
  const mkvparser::CuePoint* const first_cue = cues->GetFirst();
  if (first_cue == NULL) {
    fprintf(o, "%sNo cue points.\n", indent->indent_str().c_str());
    return true;
  }

  // Input has cue points, dump them:
  fprintf(o, "%sCues:", indent->indent_str().c_str());
  if (options.output_offset)
    fprintf(o, " @:%lld", cues->m_element_start);
  if (options.output_size)
    fprintf(o, " size:%lld", cues->m_element_size);
  fprintf(o, "\n");

  const mkvparser::CuePoint* cue_point = first_cue;
  int cue_point_num = 1;
  const int num_tracks = static_cast<int>(tracks.GetTracksCount());
  indent->Adjust(libwebm::kIncreaseIndent);

  do {
    for (int track_num = 0; track_num < num_tracks; ++track_num) {
      const mkvparser::Track* const track = tracks.GetTrackByIndex(track_num);
      const mkvparser::CuePoint::TrackPosition* const track_pos =
          cue_point->Find(track);

      if (track_pos != NULL) {
        const char track_type =
            (track->GetType() == mkvparser::Track::kVideo) ? 'V' : 'A';
        fprintf(o, "%sCue Point:%d type:%c track:%d",
                indent->indent_str().c_str(), cue_point_num, track_type,
                static_cast<int>(track->GetNumber()));

        if (options.output_seconds) {
          fprintf(o, " secs:%g",
                  cue_point->GetTime(&segment) / kNanosecondsPerSecond);
        } else {
          fprintf(o, " nano:%lld", cue_point->GetTime(&segment));
        }

        if (options.output_blocks)
          fprintf(o, " block:%lld", track_pos->m_block);

        if (options.output_offset)
          fprintf(o, " @:%lld", track_pos->m_pos);

        fprintf(o, "\n");
      }
    }

    cue_point = cues->GetNext(cue_point);
    ++cue_point_num;
  } while (cue_point != NULL);

  indent->Adjust(libwebm::kDecreaseIndent);
  return true;
}